

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

uint prvTidyApparentVersion(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  uint uVar2;
  ulong uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  uVar5 = doc->lexer->doctype;
  if (((uVar5 == 0x1000) || (uVar5 == 0x800)) && ((doc->lexer->versions & uVar5) != 0)) {
    return uVar5;
  }
  pLVar1 = doc->lexer;
  uVar5 = pLVar1->doctype;
  uVar6 = *(uint *)((doc->config).value + 0xe);
  if ((*(int *)((doc->config).value + 100) == 0) && (pLVar1->isvoyager == no)) {
    bVar8 = false;
  }
  else {
    bVar8 = *(int *)((doc->config).value + 0x21) == 0;
  }
  bVar7 = 1 < uVar6 - 3;
  bVar9 = (uVar5 & 0x1ffc) == 0;
  uVar2 = (uint)bVar8 * 0x20000 + 0x20000;
  if (((uVar5 != 0) && (uVar2 = 0x20000, (uVar5 != 0x60000 | bVar8) == 1)) &&
     (((((bVar9 && bVar7) && (uVar6 & 0xfffffffd) == 0) & bVar8) != 1 ||
      (uVar2 = 0x40000, (pLVar1->versions & 0x60000) != 0x40000)))) {
    uVar5 = 0;
    puVar4 = &W3C_Doctypes[0].vers;
    uVar3 = 0;
    for (uVar6 = 0; uVar6 != 0x13; uVar6 = uVar6 + 1) {
      if ((((bVar8 == false) || ((*puVar4 & 0x41f00) != 0)) &&
          (bVar9 && bVar7 || (*puVar4 & 0x1ffc) != 0)) &&
         (((*puVar4 & pLVar1->versions) != 0 && (((_doctypes *)(puVar4 + -1))->score <= uVar5 - 1)))
         ) {
        uVar3 = (ulong)uVar6;
        uVar5 = ((_doctypes *)(puVar4 + -1))->score;
      }
      puVar4 = puVar4 + 10;
    }
    if (uVar5 != 0) {
      return W3C_Doctypes[uVar3].vers;
    }
    return 0;
  }
  return uVar2;
}

Assistant:

uint TY_(ApparentVersion)( TidyDocImpl* doc )
{
    if ((doc->lexer->doctype == XH11 ||
         doc->lexer->doctype == XB10) &&
        (doc->lexer->versions & doc->lexer->doctype))
        return doc->lexer->doctype;
    else
        return TY_(HTMLVersion)(doc);
}